

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OSMisc.c
# Opt level: O2

char PromptForUserInput(void)

{
  ssize_t sVar1;
  char cVar2;
  termios back;
  char buf [32];
  termios term;
  
  fwrite("Press any key to continue . . . ",0x20,1,_stdout);
  fflush(_stdout);
  tcgetattr(0,(termios *)&term);
  back.c_iflag = term.c_iflag;
  back.c_oflag = term.c_oflag;
  back.c_cc[7] = term.c_cc[7];
  back.c_cc[8] = term.c_cc[8];
  back.c_cc[9] = term.c_cc[9];
  back.c_cc[10] = term.c_cc[10];
  back.c_cc[0xb] = term.c_cc[0xb];
  back.c_cc[0xc] = term.c_cc[0xc];
  back.c_cc[0xd] = term.c_cc[0xd];
  back.c_cc[0xe] = term.c_cc[0xe];
  back.c_cc[0xf] = term.c_cc[0xf];
  back.c_cc[0x10] = term.c_cc[0x10];
  back.c_cc[0x11] = term.c_cc[0x11];
  back.c_cc[0x12] = term.c_cc[0x12];
  back.c_cc[0x13] = term.c_cc[0x13];
  back.c_cc[0x14] = term.c_cc[0x14];
  back.c_cc[0x15] = term.c_cc[0x15];
  back.c_cc[0x16] = term.c_cc[0x16];
  back.c_ispeed = term.c_ispeed;
  back.c_ospeed = term.c_ospeed;
  term.c_lflag = term.c_lflag & 0xfffffff5;
  term.c_cc[5] = '\0';
  term.c_cc[6] = '\x01';
  tcsetattr(0,2,(termios *)&term);
  tcflush(0,0);
  buf[0] = '\0';
  buf[1] = '\0';
  buf[2] = '\0';
  buf[3] = '\0';
  buf[4] = '\0';
  buf[5] = '\0';
  buf[6] = '\0';
  buf[7] = '\0';
  buf[8] = '\0';
  buf[9] = '\0';
  buf[10] = '\0';
  buf[0xb] = '\0';
  buf[0xc] = '\0';
  buf[0xd] = '\0';
  buf[0xe] = '\0';
  buf[0xf] = '\0';
  buf[0x10] = '\0';
  buf[0x11] = '\0';
  buf[0x12] = '\0';
  buf[0x13] = '\0';
  buf[0x14] = '\0';
  buf[0x15] = '\0';
  buf[0x16] = '\0';
  buf[0x17] = '\0';
  buf[0x18] = '\0';
  buf[0x19] = '\0';
  buf[0x1a] = '\0';
  buf[0x1b] = '\0';
  buf[0x1c] = '\0';
  buf[0x1d] = '\0';
  buf[0x1e] = '\0';
  buf[0x1f] = '\0';
  sVar1 = read(0,buf,0x20);
  cVar2 = '\0';
  if (sVar1 != 0) {
    cVar2 = buf[0];
  }
  tcsetattr(0,2,(termios *)&back);
  fputc(10,_stdout);
  fflush(_stdout);
  return cVar2;
}

Assistant:

char PromptForUserInput(void)
{
#ifdef _WIN32
	HANDLE hStdin = INVALID_HANDLE_VALUE;
	DWORD fdwMode = 0, fdwSaveOldMode = 0;
	INPUT_RECORD irInBuf[1]; 
	DWORD cNumRead = 0;
	//char buf[32];
	//DWORD dwReadBytes = 0;

	fprintf(stdout, "Press any key to continue . . . ");
	fflush(stdout);

	hStdin = CreateFile(_T("CONIN$"), 
		GENERIC_READ|GENERIC_WRITE,
		FILE_SHARE_READ|FILE_SHARE_WRITE, 
		NULL, // No security attributes.
		OPEN_EXISTING, // Must use OPEN_EXISTING.
		0,    // Ignored for console.
		NULL  // Ignored for console.
		);

	//hStdin = GetStdHandle(STD_INPUT_HANDLE); 

	GetConsoleMode(hStdin, &fdwSaveOldMode);

	//fdwMode = fdwSaveOldMode&~(ENABLE_LINE_INPUT|ENABLE_ECHO_INPUT);
	fdwMode = ENABLE_PROCESSED_INPUT;

	SetConsoleMode(hStdin, fdwMode);

	FlushConsoleInputBuffer(hStdin);

	memset(irInBuf, 0, 1*sizeof(INPUT_RECORD));
	//memset(buf, 0, 32);

	//if (WaitForSingleObject(hStdin, INFINITE) == WAIT_OBJECT_0)
	//	ReadConsoleInput(hStdin, irInBuf, 1, &cNumRead);
	//	//ReadFile(hStdin, buf, 32, &dwReadBytes, NULL);

	while (irInBuf->EventType != KEY_EVENT)
		ReadConsoleInput(hStdin, irInBuf, 1, &cNumRead);

	SetConsoleMode(hStdin, fdwSaveOldMode);
	
	//FlushConsoleInputBuffer(hStdin);

	CloseHandle(hStdin);

	fprintf(stdout, "\n");
	fflush(stdout);

	return (char)irInBuf[0].Event.KeyEvent.uChar.AsciiChar;
	//return buf[0];
#else 
	struct termios term, back;
	char buf[32];
	ssize_t nbbytes = 0;

	fprintf(stdout, "Press any key to continue . . . ");
	fflush(stdout);

	tcgetattr(STDIN_FILENO, &term); // Get the stdin terminal information.
	memcpy(&back, &term, sizeof(term)); // Save it.

	term.c_lflag &= ~(ICANON|ECHO); // Modify terminal options.
	term.c_cc[VTIME] = 0; // Infinite waiting time.
	term.c_cc[VMIN] = 1; // Minimum number of characters.

	tcsetattr(STDIN_FILENO, TCSAFLUSH, &term); // Modify stdin attributes.

	tcflush(STDIN_FILENO, TCIFLUSH); // Flush any previous input on stdin.

	memset(buf, 0, 32);

	nbbytes = read(STDIN_FILENO, buf, 32); // Wait for a character.

	if (nbbytes == 0) buf[0] = 0;

	tcsetattr(STDIN_FILENO, TCSAFLUSH, &back); // Restore previous attributes.

	fprintf(stdout, "\n");
	fflush(stdout);

	return buf[0];
#endif // _WIN32
}